

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

JavascriptGenerator *
Js::JavascriptGenerator::New
          (Recycler *recycler,DynamicType *generatorType,Arguments *args,
          ScriptFunction *scriptFunction)

{
  DynamicType *this;
  Recycler *pRVar1;
  void **values;
  TrackAllocData local_f0;
  code *local_c8;
  undefined8 local_c0;
  TrackAllocData local_b8;
  Recycler *local_90;
  JavascriptGenerator *obj;
  undefined1 local_80 [8];
  Arguments heapArgs;
  TrackAllocData local_60;
  WriteBarrierPtr<void> *local_38;
  Type *argValuesCopy;
  ScriptFunction *scriptFunction_local;
  Arguments *args_local;
  DynamicType *generatorType_local;
  Recycler *recycler_local;
  
  local_38 = (WriteBarrierPtr<void> *)0x0;
  argValuesCopy = (Type *)scriptFunction;
  scriptFunction_local = (ScriptFunction *)args;
  args_local = (Arguments *)generatorType;
  generatorType_local = (DynamicType *)recycler;
  if (((ulong)args->Info & 0xffffff) != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
               (ulong)(SUB84(args->Info,0) & 0xffffff),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
               ,0x4e);
    pRVar1 = Memory::Recycler::TrackAllocInfo(recycler,&local_60);
    heapArgs.Values = (Type)Memory::Recycler::Alloc;
    local_38 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                         ((Memory *)pRVar1,(Recycler *)Memory::Recycler::Alloc,0,
                          (ulong)((uint)(scriptFunction_local->super_ScriptFunctionBase).
                                        super_JavascriptFunction.super_DynamicObject.
                                        super_RecyclableObject.super_FinalizableObject.
                                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject &
                                 0xffffff));
    Memory::CopyArray<void,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (local_38,(ulong)((uint)(scriptFunction_local->super_ScriptFunctionBase).
                                      super_JavascriptFunction.super_DynamicObject.
                                      super_RecyclableObject.super_FinalizableObject.
                                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject &
                               0xffffff),
               (void **)(scriptFunction_local->super_ScriptFunctionBase).super_JavascriptFunction.
                        super_DynamicObject.super_RecyclableObject.type.ptr,
               (ulong)((uint)(scriptFunction_local->super_ScriptFunctionBase).
                             super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject & 0xffffff));
  }
  obj = (JavascriptGenerator *)
        (scriptFunction_local->super_ScriptFunctionBase).super_JavascriptFunction.
        super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  values = unsafe_write_barrier_cast<void**,Memory::WriteBarrierPtr<void>*>(local_38);
  Arguments::Arguments((Arguments *)local_80,(CallInfo)obj,values);
  this = generatorType_local;
  if ((DAT_01eca37e & 1) == 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_f0,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
               ,0x6d);
    pRVar1 = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_f0);
    pRVar1 = (Recycler *)new<Memory::Recycler>(0x60,pRVar1,0x43c4b0);
    JavascriptGenerator((JavascriptGenerator *)pRVar1,(DynamicType *)args_local,
                        (Arguments *)local_80,(ScriptFunction *)argValuesCopy);
    recycler_local = pRVar1;
  }
  else {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b8,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
               ,0x5c);
    pRVar1 = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_b8);
    local_c8 = Memory::Recycler::AllocFinalizedInlined;
    local_c0 = 0;
    pRVar1 = (Recycler *)new<Memory::Recycler>(0x60,pRVar1,0x4642b0);
    JavascriptGenerator((JavascriptGenerator *)pRVar1,(DynamicType *)args_local,
                        (Arguments *)local_80,(ScriptFunction *)argValuesCopy);
    local_90 = pRVar1;
    if ((pRVar1->pinnedObjectMap).allocator != (HeapAllocator *)0x0) {
      Memory::Recycler::RegisterPendingWriteBarrierBlock
                ((Recycler *)generatorType_local,(pRVar1->pinnedObjectMap).allocator,
                 (ulong)(SUB84(((Type *)&pRVar1->heapBlockMap)->Info,0) & 0xffffff) << 3);
      Memory::Recycler::RegisterPendingWriteBarrierBlock
                ((Recycler *)generatorType_local,&local_90->pinnedObjectMap,8);
    }
    recycler_local = local_90;
  }
  return (JavascriptGenerator *)recycler_local;
}

Assistant:

JavascriptGenerator* JavascriptGenerator::New(
    Recycler* recycler,
    DynamicType* generatorType,
    Arguments& args,
    ScriptFunction* scriptFunction)
{
    // InterpreterStackFrame takes a pointer to the args, so copy them to the recycler
    // heap and use that buffer for the generator's InterpreterStackFrame
    Field(Var)* argValuesCopy = nullptr;

    if (args.Info.Count > 0)
    {
        argValuesCopy = RecyclerNewArray(recycler, Field(Var), args.Info.Count);
        CopyArray(argValuesCopy, args.Info.Count, args.Values, args.Info.Count);
    }

    Arguments heapArgs(args.Info, unsafe_write_barrier_cast<Var*>(argValuesCopy));

#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        JavascriptGenerator* obj = RecyclerNewFinalized(
            recycler,
            JavascriptGenerator,
            generatorType,
            heapArgs,
            scriptFunction);

        if (obj->args.Values != nullptr)
        {
            recycler->RegisterPendingWriteBarrierBlock(
                obj->args.Values,
                obj->args.Info.Count * sizeof(Var));

            recycler->RegisterPendingWriteBarrierBlock(
                &obj->args.Values,
                sizeof(Var*));
        }

        return obj;
    }
#endif

    return RecyclerNew(recycler, JavascriptGenerator, generatorType, heapArgs, scriptFunction);
}